

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

string * __thiscall
cmFunctionHelperCommand::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmFunctionHelperCommand *this)

{
  const_reference pvVar1;
  cmFunctionHelperCommand *this_local;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->Args,0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetName() const { return this->Args[0]; }